

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassManager.cc
# Opt level: O0

void __thiscall flow::PassManager::run(PassManager *this,IRHandler *handler)

{
  bool bVar1;
  size_t in_RCX;
  uchar *sig;
  char *ctx;
  uchar *in_R8;
  size_t in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reference local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>
  *pass;
  iterator __end2;
  iterator __begin2;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  *__range2;
  int changes;
  IRHandler *handler_local;
  PassManager *this_local;
  
  do {
    __range2._4_4_ = 0;
    __end2 = std::__cxx11::
             list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
             ::begin(&this->handlerPasses_);
    pass = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>
            *)std::__cxx11::
              list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
              ::end(&this->handlerPasses_);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&pass), bVar1) {
      local_40 = std::
                 _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>
                 ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_60,(string *)local_40);
      logDebug<std::__cxx11::string>(this,"executing pass {}:",&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      bVar1 = std::function<bool_(flow::IRHandler_*)>::operator()(&local_40->second,handler);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_90,(string *)local_40);
        ctx = "pass {}: changes detected";
        logDebug<std::__cxx11::string>(this,"pass {}: changes detected",&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        IRHandler::verify(handler,(EVP_PKEY_CTX *)ctx,sig,in_RCX,in_R8,in_R9);
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      std::
      _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>
      ::operator++(&__end2);
    }
    logDebug<int>(this,"{} changes detected",__range2._4_4_);
  } while (__range2._4_4_ != 0);
  return;
}

Assistant:

void PassManager::run(IRHandler* handler) {
  for (;;) {
    int changes = 0;
    for (const std::pair<std::string, HandlerPass>& pass : handlerPasses_) {
      logDebug("executing pass {}:", pass.first);
      if (pass.second(handler)) {
        logDebug("pass {}: changes detected", pass.first);
        handler->verify();
        changes++;
      }
    }
    logDebug("{} changes detected", changes);
    if (!changes) {
      break;
    }
  }
}